

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::MediaAccumulator::
try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
          (MediaAccumulator *this,IntType platforms,char *extension)

{
  bool bVar1;
  char *extension_local;
  IntType platforms_local;
  MediaAccumulator *this_local;
  
  bVar1 = anon_unknown.dwarf_387fdd::MediaAccumulator::name_matches
                    ((MediaAccumulator *)this,extension);
  if (bVar1) {
    try_insert<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>,std::__cxx11::string_const&>
              (this,platforms,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0x60))
    ;
  }
  return;
}

Assistant:

void try_standard(TargetPlatform::IntType platforms, const char *extension) {
		if(name_matches(extension))	{
			try_insert<InstanceT>(platforms, file_name_);
		}
	}